

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::HeapAllocator>::Clear(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  bool bVar1;
  BVIndex index;
  BVSparseNode *pBVar2;
  BVSparseNode *current;
  Type_conflict *prevNextField;
  BVSparse<Memory::HeapAllocator> *pBStack_10;
  BVIndex i_local;
  BVSparse<Memory::HeapAllocator> *this_local;
  
  current = (BVSparseNode *)0x0;
  prevNextField._4_4_ = i;
  pBStack_10 = this;
  pBVar2 = NodeFromIndex(this,i,(Type_conflict **)&current,false);
  if (pBVar2 != (BVSparseNode *)0x0) {
    index = BVUnitT<unsigned_long>::Offset(prevNextField._4_4_);
    BVUnitT<unsigned_long>::Clear(&pBVar2->data,index);
    bVar1 = BVUnitT<unsigned_long>::IsEmpty(&pBVar2->data);
    if (bVar1) {
      pBVar2 = DeleteNode(this,pBVar2,false);
      current->next = pBVar2;
    }
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::Clear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if(current)
    {
        current->data.Clear(SparseBVUnit::Offset(i));
        if (current->data.IsEmpty())
        {
            *prevNextField = this->DeleteNode(current, false);
        }
    }
}